

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::predict_or_learn_bag<false>(cb_explore *data,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  action_scores probs;
  action_score local_60;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_58._begin = (action_score *)(ec->pred).scalars._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  if ((data->cbcs).num_actions != 0) {
    uVar3 = 0;
    do {
      local_60.score = 0.0;
      local_60.action = uVar3;
      v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_60);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (data->cbcs).num_actions);
  }
  uVar2 = data->bag_size;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      merand48(&data->all->random_state);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar4);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar4);
      uVar3 = (ec->pred).multiclass - 1;
      local_58._begin[uVar3].score = local_58._begin[uVar3].score + 1.0 / (float)uVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 < data->bag_size);
  }
  (ec->pred).scalars.end_array = (float *)local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).a_s._begin = local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  action_scores probs = ec.pred.a_s;
  probs.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
  float prob = 1.f / (float)data.bag_size;
  for (size_t i = 0; i < data.bag_size; i++)
  {
    uint32_t count = BS::weight_gen(*data.all);
    if (is_learn && count > 0)
      base.learn(ec, i);
    else
      base.predict(ec, i);
    uint32_t chosen = ec.pred.multiclass - 1;
    probs[chosen].score += prob;
    if (is_learn)
      for (uint32_t j = 1; j < count; j++) base.learn(ec, i);
  }

  ec.pred.a_s = probs;
}